

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiAnalyzerSettings.cpp
# Opt level: O3

void __thiscall MidiAnalyzerSettings::LoadSettings(MidiAnalyzerSettings *this,char *settings)

{
  SimpleArchive text_archive;
  SimpleArchive local_20 [8];
  
  SimpleArchive::SimpleArchive(local_20);
  SimpleArchive::SetString((char *)local_20);
  SimpleArchive::operator>>(local_20,&this->mInputChannel);
  SimpleArchive::operator>>(local_20,&this->mBitRate);
  SimpleArchive::operator>>(local_20,&this->mStopBits);
  SimpleArchive::operator>>(local_20,&this->mParity);
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mInputChannelInterface)._M_ptr);
  SimpleArchive::~SimpleArchive(local_20);
  return;
}

Assistant:

void MidiAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    text_archive >> mInputChannel;
    text_archive >> mBitRate;
    text_archive >> mStopBits;
    text_archive >> mParity;

    ClearChannels();
    AddChannel( mInputChannel, "MIDI", true );

    UpdateInterfacesFromSettings();
}